

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O1

string * __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::to_string__abi_cxx11_
          (string *__return_storage_ptr__,ansicolor_sink<spdlog::details::console_nullmutex> *this,
          string_view_t *sv)

{
  _func_int **pp_Var1;
  long lVar2;
  
  pp_Var1 = (this->super_sink)._vptr_sink;
  lVar2 = *(long *)&(this->super_sink).level_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pp_Var1,lVar2 + (long)pp_Var1);
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_INLINE std::string ansicolor_sink<ConsoleMutex>::to_string_(const string_view_t &sv)
{
    return std::string(sv.data(), sv.size());
}